

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWriteFileCommand.h
# Opt level: O0

cmCommand * __thiscall cmWriteFileCommand::Clone(cmWriteFileCommand *this)

{
  cmCommand *this_00;
  cmWriteFileCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmWriteFileCommand((cmWriteFileCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmWriteFileCommand;
    }